

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_AddIntrinsicTypedArrays(JSContext *ctx)

{
  JSValue *pJVar1;
  char *name;
  JSAtom atom;
  int64_t iVar2;
  long lVar3;
  int64_t in_R9;
  ulong uVar4;
  long lVar5;
  JSValue this_obj;
  JSValue JVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue val;
  JSValue proto;
  JSValue val_00;
  char buf [64];
  
  pJVar1 = ctx->class_proto;
  JVar6 = JS_NewObject(ctx);
  pJVar1[0x13] = JVar6;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x13],js_array_buffer_proto_funcs,3);
  JVar6.tag = in_R9;
  JVar6.u = (JSValueUnion)(JSValueUnion)ctx->class_proto[0x13].tag;
  JVar6 = JS_NewGlobalCConstructorOnly
                    (ctx,"ArrayBuffer",js_array_buffer_constructor,ctx->class_proto[0x13].u.int32,
                     JVar6);
  JS_SetPropertyFunctionList(ctx,JVar6,js_array_buffer_funcs,2);
  pJVar1 = ctx->class_proto;
  JVar6 = JS_NewObject(ctx);
  pJVar1[0x14] = JVar6;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x14],js_shared_array_buffer_proto_funcs,3);
  JVar7.tag = in_R9;
  JVar7.u = (JSValueUnion)(JSValueUnion)ctx->class_proto[0x14].tag;
  JVar6 = JS_NewGlobalCConstructorOnly
                    (ctx,"SharedArrayBuffer",js_shared_array_buffer_constructor,
                     ctx->class_proto[0x14].u.int32,JVar7);
  JS_SetPropertyFunctionList(ctx,JVar6,js_shared_array_buffer_funcs,1);
  JVar6 = JS_NewObject(ctx);
  JS_SetPropertyFunctionList(ctx,JVar6,js_typed_array_base_proto_funcs,0x1e);
  JVar7 = JS_GetPropertyInternal(ctx,ctx->class_proto[2],0x37,ctx->class_proto[2],0);
  iVar2 = JVar7.tag;
  JS_DefinePropertyValue(ctx,JVar6,0x37,JVar7,3);
  JVar7 = JS_NewCFunction(ctx,js_typed_array_base_constructor,"TypedArray",0);
  JS_SetPropertyFunctionList(ctx,JVar7,js_typed_array_base_funcs,3);
  JS_SetConstructor(ctx,JVar7,JVar6);
  lVar3 = 0x158;
  for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
    pJVar1 = ctx->class_proto;
    JVar8 = JS_NewObjectProto(ctx,JVar6);
    *(JSValueUnion *)((long)pJVar1 + lVar3 + -8) = JVar8.u;
    *(int64_t *)((long)&pJVar1->u + lVar3) = JVar8.tag;
    uVar4 = 1L << (""[lVar5] & 0x3f);
    atom = 0x169401;
    this_obj.tag = *(int64_t *)((long)&ctx->class_proto->u + lVar3);
    this_obj.u.ptr = ((JSValueUnion *)((long)ctx->class_proto + lVar3 + -8))->ptr;
    val.tag = 0;
    val.u.ptr = (void *)uVar4;
    JS_DefinePropertyValueStr(ctx,this_obj,"BYTES_PER_ELEMENT",val,0);
    name = JS_AtomGetStr(ctx,buf,(int)lVar5 + 0xa0,atom);
    JVar8 = JS_NewCFunction3(ctx,js_typed_array_constructor,name,3,JS_CFUNC_constructor_magic,
                             (int)lVar5 + 0x15,JVar7);
    proto.tag = *(int64_t *)((long)&ctx->class_proto->u + lVar3);
    proto.u.ptr = ((JSValueUnion *)((long)ctx->class_proto + lVar3 + -8))->ptr;
    JS_NewGlobalCConstructor2(ctx,JVar8,name,proto);
    iVar2 = 0;
    val_00.tag = 0;
    val_00.u.ptr = (void *)uVar4;
    JS_DefinePropertyValueStr(ctx,JVar8,"BYTES_PER_ELEMENT",val_00,0);
    lVar3 = lVar3 + 0x10;
  }
  JS_FreeValue(ctx,JVar6);
  JS_FreeValue(ctx,JVar7);
  pJVar1 = ctx->class_proto;
  JVar6 = JS_NewObject(ctx);
  pJVar1[0x1e] = JVar6;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x1e],js_dataview_proto_funcs,0x14);
  JVar8.tag = iVar2;
  JVar8.u = (JSValueUnion)(JSValueUnion)ctx->class_proto[0x1e].tag;
  JS_NewGlobalCConstructorOnly
            (ctx,"DataView",js_dataview_constructor,ctx->class_proto[0x1e].u.int32,JVar8);
  JS_AddIntrinsicAtomics(ctx);
  return;
}

Assistant:

void JS_AddIntrinsicTypedArrays(JSContext *ctx)
{
    JSValue typed_array_base_proto, typed_array_base_func;
    JSValueConst array_buffer_func, shared_array_buffer_func;
    int i;

    ctx->class_proto[JS_CLASS_ARRAY_BUFFER] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY_BUFFER],
                               js_array_buffer_proto_funcs,
                               countof(js_array_buffer_proto_funcs));

    array_buffer_func = JS_NewGlobalCConstructorOnly(ctx, "ArrayBuffer",
                                                 js_array_buffer_constructor, 1,
                                                 ctx->class_proto[JS_CLASS_ARRAY_BUFFER]);
    JS_SetPropertyFunctionList(ctx, array_buffer_func,
                               js_array_buffer_funcs,
                               countof(js_array_buffer_funcs));

    ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER],
                               js_shared_array_buffer_proto_funcs,
                               countof(js_shared_array_buffer_proto_funcs));

    shared_array_buffer_func = JS_NewGlobalCConstructorOnly(ctx, "SharedArrayBuffer",
                                                 js_shared_array_buffer_constructor, 1,
                                                 ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER]);
    JS_SetPropertyFunctionList(ctx, shared_array_buffer_func,
                               js_shared_array_buffer_funcs,
                               countof(js_shared_array_buffer_funcs));

    typed_array_base_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, typed_array_base_proto,
                               js_typed_array_base_proto_funcs,
                               countof(js_typed_array_base_proto_funcs));

    /* TypedArray.prototype.toString must be the same object as Array.prototype.toString */
    JSValue obj = JS_GetProperty(ctx, ctx->class_proto[JS_CLASS_ARRAY], JS_ATOM_toString);
    /* XXX: should use alias method in JSCFunctionListEntry */ //@@@
    JS_DefinePropertyValue(ctx, typed_array_base_proto, JS_ATOM_toString, obj,
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);

    typed_array_base_func = JS_NewCFunction(ctx, js_typed_array_base_constructor,
                                            "TypedArray", 0);
    JS_SetPropertyFunctionList(ctx, typed_array_base_func,
                               js_typed_array_base_funcs,
                               countof(js_typed_array_base_funcs));
    JS_SetConstructor(ctx, typed_array_base_func, typed_array_base_proto);

    for(i = JS_CLASS_UINT8C_ARRAY; i < JS_CLASS_UINT8C_ARRAY + JS_TYPED_ARRAY_COUNT; i++) {
        JSValue func_obj;
        char buf[ATOM_GET_STR_BUF_SIZE];
        const char *name;

        ctx->class_proto[i] = JS_NewObjectProto(ctx, typed_array_base_proto);
        JS_DefinePropertyValueStr(ctx, ctx->class_proto[i],
                                  "BYTES_PER_ELEMENT",
                                  JS_NewInt32(ctx, 1 << typed_array_size_log2(i)),
                                  0);
        name = JS_AtomGetStr(ctx, buf, sizeof(buf),
                             JS_ATOM_Uint8ClampedArray + i - JS_CLASS_UINT8C_ARRAY);
        func_obj = JS_NewCFunction3(ctx, (JSCFunction *)js_typed_array_constructor,
                                    name, 3, JS_CFUNC_constructor_magic, i,
                                    typed_array_base_func);
        JS_NewGlobalCConstructor2(ctx, func_obj, name, ctx->class_proto[i]);
        JS_DefinePropertyValueStr(ctx, func_obj,
                                  "BYTES_PER_ELEMENT",
                                  JS_NewInt32(ctx, 1 << typed_array_size_log2(i)),
                                  0);
    }
    JS_FreeValue(ctx, typed_array_base_proto);
    JS_FreeValue(ctx, typed_array_base_func);

    /* DataView */
    ctx->class_proto[JS_CLASS_DATAVIEW] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_DATAVIEW],
                               js_dataview_proto_funcs,
                               countof(js_dataview_proto_funcs));
    JS_NewGlobalCConstructorOnly(ctx, "DataView",
                                 js_dataview_constructor, 1,
                                 ctx->class_proto[JS_CLASS_DATAVIEW]);
    /* Atomics */
#ifdef CONFIG_ATOMICS
    JS_AddIntrinsicAtomics(ctx);
#endif
}